

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O2

void __thiscall
Nova::Grid_Iterator_Cell<float,_2>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_2> *this,Grid<float,_2> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  TV *pTVar1;
  T_Region TVar2;
  int iVar3;
  int *piVar4;
  int axis;
  uint uVar5;
  char *__assertion;
  Range<int,_2> *this_00;
  int iVar6;
  Range<int,_2> domain;
  T_INDEX max_copy;
  T_STORAGE aTStack_40 [2];
  
  this_00 = &domain;
  Grid_Iterator<float,_2>::Grid_Iterator(&this->super_Grid_Iterator<float,_2>,grid_input);
  if (4 < (uint)side) {
    __assertion = "side>=0 && side<=2*d";
    uVar5 = 0xe;
LAB_00129c61:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,uVar5,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  if ((*region_type & ~Ghost_Region) == Boundary_Region) {
    __assertion = 
    "(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)";
    uVar5 = 0xf;
    goto LAB_00129c61;
  }
  Grid<float,_2>::Cell_Indices
            ((Grid<float,_2> *)&domain,(int)(this->super_Grid_Iterator<float,_2>).grid);
  TVar2 = *region_type;
  if (TVar2 == Boundary_Interior_Region) {
    if (side == 0) {
      pTVar1 = &domain.max_corner;
      max_copy._data._M_elems = domain.min_corner._data._M_elems;
      aTStack_40[0]._M_elems = (_Type)domain.max_corner._data._M_elems;
      for (iVar6 = 1; -1 < iVar6; iVar6 = iVar6 + -1) {
        piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar6);
        iVar3 = *piVar4;
        piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
        *piVar4 = iVar3;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&domain);
        piVar4 = Vector<int,_2,_true>::operator()((Vector<int,_2,_true> *)aTStack_40,iVar6);
        iVar3 = *piVar4;
        piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar6);
        *piVar4 = iVar3;
        piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
        *piVar4 = iVar3;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&domain);
        piVar4 = Vector<int,_2,_true>::operator()((Vector<int,_2,_true> *)aTStack_40,iVar6);
        iVar3 = *piVar4;
        piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
        *piVar4 = iVar3 + -1;
        piVar4 = Vector<int,_2,_true>::operator()(&max_copy,iVar6);
        iVar3 = *piVar4;
        piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar6);
        *piVar4 = iVar3 + 1;
      }
      goto LAB_00129bff;
    }
    uVar5 = side - 1U >> 1;
    if ((side & 1U) == 0) {
      piVar4 = Vector<int,_2,_true>::operator()(&domain.max_corner,uVar5);
      this_00 = &domain;
    }
    else {
      piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,uVar5);
      this_00 = (Range<int,_2> *)&domain.max_corner;
    }
    iVar6 = *piVar4;
LAB_00129bea:
    piVar4 = Vector<int,_2,_true>::operator()(&this_00->min_corner,uVar5);
    *piVar4 = iVar6;
  }
  else {
    if (TVar2 != Whole_Region) {
      if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
        __assertion = "(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)";
        uVar5 = 0x2e;
        goto LAB_00129c61;
      }
      if (side == 0) {
        pTVar1 = &domain.max_corner;
        max_copy._data._M_elems = domain.max_corner._data._M_elems;
        for (iVar6 = 1; -1 < iVar6; iVar6 = iVar6 + -1) {
          piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
          *piVar4 = 0;
          Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&domain);
          piVar4 = Vector<int,_2,_true>::operator()(&max_copy,iVar6);
          iVar3 = *piVar4;
          piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
          *piVar4 = iVar3;
          piVar4 = Vector<int,_2,_true>::operator()
                             (&((this->super_Grid_Iterator<float,_2>).grid)->counts,iVar6);
          iVar3 = *piVar4;
          piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar6);
          *piVar4 = iVar3 + 1;
          Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&domain);
          piVar4 = Vector<int,_2,_true>::operator()
                             (&((this->super_Grid_Iterator<float,_2>).grid)->counts,iVar6);
          iVar3 = *piVar4;
          piVar4 = Vector<int,_2,_true>::operator()(pTVar1,iVar6);
          *piVar4 = iVar3;
          piVar4 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar6);
          *piVar4 = 1;
        }
        goto LAB_00129bff;
      }
      uVar5 = side - 1U >> 1;
      if ((side & 1U) == 0) {
        piVar4 = Vector<int,_2,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_2>).grid)->counts,uVar5);
        iVar6 = *piVar4 + 1;
      }
      else {
        iVar6 = 0;
        this_00 = (Range<int,_2> *)&domain.max_corner;
      }
      goto LAB_00129bea;
    }
    if (side != 0) {
      __assertion = "!side";
      uVar5 = 0x14;
      goto LAB_00129c61;
    }
  }
  Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&domain);
LAB_00129bff:
  Grid_Iterator<float,_2>::Reset(&this->super_Grid_Iterator<float,_2>,0);
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}